

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O2

size_t tinfl_decompress_mem_to_mem
                 (void *pOut_buf,size_t out_buf_len,void *pSrc_buf,size_t src_buf_len,int flags)

{
  tinfl_status tVar1;
  undefined1 local_2b18 [8];
  tinfl_decompressor decomp;
  size_t out_buf_len_local;
  size_t src_buf_len_local;
  
  local_2b18._0_4_ = 0;
  decomp._10992_8_ = out_buf_len;
  out_buf_len_local = src_buf_len;
  tVar1 = tinfl_decompress((tinfl_decompressor *)local_2b18,(mz_uint8 *)pSrc_buf,&out_buf_len_local,
                           (mz_uint8 *)pOut_buf,(mz_uint8 *)pOut_buf,
                           (size_t *)(decomp.m_len_codes + 0x1c4),flags & 0xfffffff9U | 4);
  return -(ulong)(tVar1 != TINFL_STATUS_DONE) | decomp._10992_8_;
}

Assistant:

size_t tinfl_decompress_mem_to_mem(void *pOut_buf, size_t out_buf_len, const void *pSrc_buf,
    size_t src_buf_len, int flags)
{
    tinfl_decompressor decomp;
    tinfl_status status;
    tinfl_init(&decomp);
    status = tinfl_decompress(&decomp, (const mz_uint8*)pSrc_buf, &src_buf_len,
            (mz_uint8*)pOut_buf, (mz_uint8*)pOut_buf, &out_buf_len,
            (flags & ~TINFL_FLAG_HAS_MORE_INPUT) |
            TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF);
    return (status != TINFL_STATUS_DONE) ? TINFL_DECOMPRESS_MEM_TO_MEM_FAILED : out_buf_len;
}